

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_factory.cpp
# Opt level: O0

shared_ptr<cpp_db::driver_interface> __thiscall
cpp_db::driver_factory::create_driver(driver_factory *this,string *name)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cpp_db::driver_interface> sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
  local_30;
  const_iterator pos;
  lock_guard<std::mutex> lg;
  string *name_local;
  driver_factory *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&pos,(mutex_type *)((long)&name[1].field_2 + 8));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>_>
               *)name,in_RDX);
  local_50._8_8_ =
       std::
       end<std::unordered_map<std::__cxx11::string,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>>>
                 ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>_>_>
                   *)name);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_true>
                      *)(local_50 + 8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"Driver not registered: ",in_RDX);
    std::runtime_error::runtime_error(this_00,(string *)&local_70);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_false,_true>
  ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>,_false,_true>
                *)&local_30);
  std::
  function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>
  ::operator()((function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>
                *)local_50);
  std::shared_ptr<cpp_db::driver_interface>::
  shared_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>,void>
            ((shared_ptr<cpp_db::driver_interface> *)this,
             (unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_> *
             )local_50);
  std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>::
  ~unique_ptr((unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>
               *)local_50);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&pos);
  sVar2.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cpp_db::driver_interface>)
         sVar2.super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<driver_interface> driver_factory::create_driver(const std::string &name) const
{
    std::lock_guard<std::mutex> lg(factory_mutex);
    auto pos = drivers.find(name);
    if (pos != std::end(drivers))
        return std::shared_ptr<driver_interface>(pos->second());
    throw std::runtime_error("Driver not registered: " + name);
}